

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ProgramSeparableCase::iterate(ProgramSeparableCase *this)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  TestError *pTVar4;
  TestContext *code;
  allocator<char> local_242;
  allocator<char> local_241;
  ScopedLogSection section;
  CallLogWrapper gl;
  int linkStatus;
  Program program;
  char *fragSourcePtr;
  Shader vtxShader;
  char *vtxSourcePtr;
  string fStr;
  string vStr;
  string fragTemplate;
  string vtxTemplate;
  Shader frgShader;
  ResultCollector result;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vtxTemplate,
             "${GLSL_VERSION_DECL}\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)&vtxShader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragTemplate,
             "${GLSL_VERSION_DECL}\nin highp vec4 v_color;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,(allocator<char> *)&vtxShader);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  code = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  glu::CallLogWrapper::CallLogWrapper(&gl,(Functions *)CONCAT44(extraout_var,iVar2),code->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vtxShader," // ERROR: ",(allocator<char> *)&frgShader);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)&vtxShader);
  std::__cxx11::string::~string((string *)&vtxShader);
  glu::Shader::Shader(&vtxShader,((this->super_TestCase).m_context)->m_renderCtx,SHADERTYPE_VERTEX);
  glu::Shader::Shader(&frgShader,((this->super_TestCase).m_context)->m_renderCtx,SHADERTYPE_FRAGMENT
                     );
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&vStr,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)vtxTemplate._M_dataplus._M_p,(char *)code);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&fStr,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)fragTemplate._M_dataplus._M_p,(char *)code);
  vtxSourcePtr = vStr._M_dataplus._M_p;
  fragSourcePtr = fStr._M_dataplus._M_p;
  glu::Shader::setSources(&vtxShader,1,&vtxSourcePtr,(int *)0x0);
  glu::Shader::setSources(&frgShader,1,&fragSourcePtr,(int *)0x0);
  glu::Shader::compile(&vtxShader);
  glu::Shader::compile(&frgShader);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&program,"VtxShader",&local_241);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkStatus,"Vertex shader",&local_242);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)&linkStatus);
  std::__cxx11::string::~string((string *)&linkStatus);
  std::__cxx11::string::~string((string *)&program);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&vtxShader
                 );
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&program,"FrgShader",&local_241);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkStatus,"Fragment shader",&local_242);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)&linkStatus);
  std::__cxx11::string::~string((string *)&linkStatus);
  std::__cxx11::string::~string((string *)&program);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&frgShader
                 );
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if ((vtxShader.m_info.compileOk != true) || (frgShader.m_info.compileOk == false)) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"failed to build shaders",
               "vtxShader.getCompileStatus() && frgShader.getCompileStatus()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x186);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&program,"Initial",&local_241);
  std::__cxx11::string::string<std::allocator<char>>((string *)&linkStatus,"Initial",&local_242);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)&linkStatus);
  std::__cxx11::string::~string((string *)&linkStatus);
  std::__cxx11::string::~string((string *)&program);
  glu::Program::Program(&program,((this->super_TestCase).m_context)->m_renderCtx);
  gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program,0x8258,0,this->m_verifier);
  glu::Program::~Program(&program);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&program,"SetFalse",&local_241);
  std::__cxx11::string::string<std::allocator<char>>((string *)&linkStatus,"SetFalse",&local_242);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)&linkStatus);
  std::__cxx11::string::~string((string *)&linkStatus);
  std::__cxx11::string::~string((string *)&program);
  glu::Program::Program(&program,((this->super_TestCase).m_context)->m_renderCtx);
  linkStatus = 0;
  glu::CallLogWrapper::glAttachShader(&gl,program.m_program,vtxShader.m_shader);
  glu::CallLogWrapper::glAttachShader(&gl,program.m_program,frgShader.m_shader);
  glu::CallLogWrapper::glProgramParameteri(&gl,program.m_program,0x8258,0);
  glu::CallLogWrapper::glLinkProgram(&gl,program.m_program);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                  ,0x19a);
  glu::CallLogWrapper::glGetProgramiv(&gl,program.m_program,0x8b82,&linkStatus);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"query link status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                  ,0x19d);
  if (linkStatus != 1) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"failed to link program","linkStatus == GL_TRUE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x19f);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  gls::StateQueryUtil::verifyStateProgramInteger
            (&result,&gl,program.m_program,0x8258,0,this->m_verifier);
  glu::Program::~Program(&program);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&program,"SetTrue",&local_241);
  std::__cxx11::string::string<std::allocator<char>>((string *)&linkStatus,"SetTrue",&local_242);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&program,(string *)&linkStatus);
  std::__cxx11::string::~string((string *)&linkStatus);
  std::__cxx11::string::~string((string *)&program);
  glu::Program::Program(&program,((this->super_TestCase).m_context)->m_renderCtx);
  linkStatus = 0;
  glu::CallLogWrapper::glAttachShader(&gl,program.m_program,vtxShader.m_shader);
  glu::CallLogWrapper::glAttachShader(&gl,program.m_program,frgShader.m_shader);
  glu::CallLogWrapper::glProgramParameteri(&gl,program.m_program,0x8258,1);
  glu::CallLogWrapper::glLinkProgram(&gl,program.m_program);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                  ,0x1ad);
  glu::CallLogWrapper::glGetProgramiv(&gl,program.m_program,0x8b82,&linkStatus);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"query link status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                  ,0x1b0);
  if (linkStatus == 1) {
    gls::StateQueryUtil::verifyStateProgramInteger
              (&result,&gl,program.m_program,0x8258,1,this->m_verifier);
    glu::Program::~Program(&program);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    tcu::ResultCollector::setTestContextResult
              (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::__cxx11::string::~string((string *)&fStr);
    std::__cxx11::string::~string((string *)&vStr);
    glu::Shader::~Shader(&frgShader);
    glu::Shader::~Shader(&vtxShader);
    tcu::ResultCollector::~ResultCollector(&result);
    glu::CallLogWrapper::~CallLogWrapper(&gl);
    std::__cxx11::string::~string((string *)&fragTemplate);
    std::__cxx11::string::~string((string *)&vtxTemplate);
    return STOP;
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"failed to link program","linkStatus == GL_TRUE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x1b2);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ProgramSeparableCase::IterateResult ProgramSeparableCase::iterate (void)
{
	const string				vtxTemplate	=	"${GLSL_VERSION_DECL}\n"
												"out highp vec4 v_color;\n"
												"void main()\n"
												"{\n"
												"	gl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n"
												"	v_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n"
												"}\n";
	const string				fragTemplate =	"${GLSL_VERSION_DECL}\n"
												"in highp vec4 v_color;\n"
												"layout(location=0) out highp vec4 o_color;\n"
												"void main()\n"
												"{\n"
												"	o_color = v_color;\n"
												"}\n";

	glu::CallLogWrapper			gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result			(m_testCtx.getLog(), " // ERROR: ");
	glu::Shader					vtxShader		(m_context.getRenderContext(), glu::SHADERTYPE_VERTEX);
	glu::Shader					frgShader		(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);

	const std::string			vStr			= specializeShader(m_context, vtxTemplate.c_str());
	const std::string			fStr			= specializeShader(m_context, fragTemplate.c_str());
	const char* const			vtxSourcePtr	= vStr.c_str();
	const char* const			fragSourcePtr	= fStr.c_str();

	vtxShader.setSources(1, &vtxSourcePtr, DE_NULL);
	frgShader.setSources(1, &fragSourcePtr, DE_NULL);

	vtxShader.compile();
	frgShader.compile();

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "VtxShader", "Vertex shader");
		m_testCtx.getLog() << vtxShader;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "FrgShader", "Fragment shader");
		m_testCtx.getLog() << frgShader;
	}

	TCU_CHECK_MSG(vtxShader.getCompileStatus() && frgShader.getCompileStatus(), "failed to build shaders");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), "Initial", "Initial");
		glu::Program				program	(m_context.getRenderContext());

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_PROGRAM_SEPARABLE, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "SetFalse", "SetFalse");
		glu::Program				program		(m_context.getRenderContext());
		int							linkStatus	= 0;

		gl.glAttachShader(program.getProgram(), vtxShader.getShader());
		gl.glAttachShader(program.getProgram(), frgShader.getShader());
		gl.glProgramParameteri(program.getProgram(), GL_PROGRAM_SEPARABLE, GL_FALSE);
		gl.glLinkProgram(program.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup program");

		gl.glGetProgramiv(program.getProgram(), GL_LINK_STATUS, &linkStatus);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query link status");

		TCU_CHECK_MSG(linkStatus == GL_TRUE, "failed to link program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_PROGRAM_SEPARABLE, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "SetTrue", "SetTrue");
		glu::Program				program		(m_context.getRenderContext());
		int							linkStatus	= 0;

		gl.glAttachShader(program.getProgram(), vtxShader.getShader());
		gl.glAttachShader(program.getProgram(), frgShader.getShader());
		gl.glProgramParameteri(program.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.glLinkProgram(program.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup program");

		gl.glGetProgramiv(program.getProgram(), GL_LINK_STATUS, &linkStatus);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query link status");

		TCU_CHECK_MSG(linkStatus == GL_TRUE, "failed to link program");

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}